

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

int32_t __thiscall icu_63::RuleBasedBreakIterator::next(RuleBasedBreakIterator *this,int32_t n)

{
  int iVar1;
  int iVar2;
  
  if (n < 1) {
    if (-1 < n) {
      iVar2 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xe])(this);
      return iVar2;
    }
    iVar2 = n + 1;
    do {
      iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xc])(this);
      if (iVar2 == 0) {
        return iVar1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar1 != -1);
  }
  else {
    do {
      iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xd])(this);
      if ((uint)n < 2) {
        return iVar1;
      }
      n = n - 1;
    } while (iVar1 != -1);
  }
  return iVar1;
}

Assistant:

int32_t RuleBasedBreakIterator::next(int32_t n) {
    int32_t result = 0;
    if (n > 0) {
        for (; n > 0 && result != UBRK_DONE; --n) {
            result = next();
        }
    } else if (n < 0) {
        for (; n < 0 && result != UBRK_DONE; ++n) {
            result = previous();
        }
    } else {
        result = current();
    }
    return result;
}